

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_muldiv_init(void)

{
  ushort uVar1;
  byte bVar2;
  uint16_t log_x;
  int x_1;
  uint8_t log_yn;
  uint8_t log_y;
  int y;
  int x;
  uint8_t *d;
  uint8_t *m;
  
  m = GF256Ctx.GF256_MUL_TABLE;
  d = GF256Ctx.GF256_DIV_TABLE;
  for (x = 0; x < 0x100; x = x + 1) {
    GF256Ctx.GF256_DIV_TABLE[x] = '\0';
    GF256Ctx.GF256_MUL_TABLE[x] = '\0';
  }
  for (y = 1; y < 0x100; y = y + 1) {
    bVar2 = (byte)GF256Ctx.GF256_LOG_TABLE[y];
    m = m + 0x100;
    d = d + 0x100;
    *m = '\0';
    *d = '\0';
    for (x_1 = 1; x_1 < 0x100; x_1 = x_1 + 1) {
      uVar1 = GF256Ctx.GF256_LOG_TABLE[x_1];
      m[x_1] = GF256Ctx.GF256_EXP_TABLE[(int)((uint)uVar1 + (uint)bVar2)];
      d[x_1] = GF256Ctx.GF256_EXP_TABLE[(int)((uint)uVar1 + (uint)(byte)(-bVar2 - 1))];
    }
  }
  return;
}

Assistant:

static void gf256_muldiv_init()
{
    // Allocate table memory 65KB x 2
    uint8_t* m = GF256Ctx.GF256_MUL_TABLE;
    uint8_t* d = GF256Ctx.GF256_DIV_TABLE;

    // Unroll y = 0 subtable
    for (int x = 0; x < 256; ++x)
        m[x] = d[x] = 0;

    // For each other y value:
    for (int y = 1; y < 256; ++y)
    {
        // Calculate log(y) for mult and 255 - log(y) for div
        const uint8_t log_y = static_cast<uint8_t>(GF256Ctx.GF256_LOG_TABLE[y]);
        const uint8_t log_yn = 255 - log_y;

        // Next subtable
        m += 256, d += 256;

        // Unroll x = 0
        m[0] = 0, d[0] = 0;

        // Calculate x * y, x / y
        for (int x = 1; x < 256; ++x)
        {
            uint16_t log_x = GF256Ctx.GF256_LOG_TABLE[x];

            m[x] = GF256Ctx.GF256_EXP_TABLE[log_x + log_y];
            d[x] = GF256Ctx.GF256_EXP_TABLE[log_x + log_yn];
        }
    }
}